

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  char *pcVar1;
  Path *pPVar2;
  Path *pPVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  bool bVar12;
  Type *rootType;
  ulong uVar13;
  long lVar14;
  value_type *elements_1;
  EVP_PKEY_CTX *pEVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  SymbolLSPMap *this_00;
  ulong uVar19;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_01;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  optional<std::pair<unsigned_long,_unsigned_long>_> local_d8;
  overlap_iterator local_c0;
  const_iterator local_70;
  
  rootType = ast::DeclaredType::getType(&symbol->declaredType);
  ast::ValueDriver::getBounds
            (&local_d8,lsp,
             &(this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).super_FlowAnalysisBase.evalContext,rootType);
  if (local_d8.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
      super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged == false) {
    bVar12 = isReferenced(this,symbol);
  }
  else {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = symbol;
    uVar19 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar13 = uVar19 >> ((this->symbolToSlot).field_0x50 & 0x3f);
    lVar14 = (uVar19 & 0xff) * 4;
    cVar8 = *(char *)(&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (uVar19 & 0xff));
    cVar9 = *(char *)((long)&boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             match_word(unsigned_long)::word + lVar14 + 1);
    cVar10 = *(char *)((long)&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word + lVar14 + 2);
    bVar11 = *(byte *)((long)&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word + lVar14 + 3);
    uVar18 = (uint)uVar19 & 7;
    uVar4 = *(ulong *)&(this->symbolToSlot).field_0x58;
    uVar16 = 0;
    do {
      pcVar1 = (char *)(*(long *)&(this->symbolToSlot).field_0x60 + uVar13 * 0x10);
      auVar20[0] = -(*pcVar1 == cVar8);
      auVar20[1] = -(pcVar1[1] == cVar9);
      auVar20[2] = -(pcVar1[2] == cVar10);
      auVar20[3] = -(pcVar1[3] == bVar11);
      auVar20[4] = -(pcVar1[4] == cVar8);
      auVar20[5] = -(pcVar1[5] == cVar9);
      auVar20[6] = -(pcVar1[6] == cVar10);
      auVar20[7] = -(pcVar1[7] == bVar11);
      auVar20[8] = -(pcVar1[8] == cVar8);
      auVar20[9] = -(pcVar1[9] == cVar9);
      auVar20[10] = -(pcVar1[10] == cVar10);
      auVar20[0xb] = -(pcVar1[0xb] == bVar11);
      auVar20[0xc] = -(pcVar1[0xc] == cVar8);
      auVar20[0xd] = -(pcVar1[0xd] == cVar9);
      auVar20[0xe] = -(pcVar1[0xe] == cVar10);
      auVar20[0xf] = -(pcVar1[0xf] == bVar11);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      if (uVar17 != 0) {
        lVar14 = *(long *)&(this->symbolToSlot).field_0x68 + uVar13 * 0xf0;
        do {
          iVar5 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar14 + (ulong)(uint)(iVar5 << 4)) == symbol) {
            this_00 = &(this->lvalues).
                       super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                       [*(uint *)(lVar14 + (ulong)(uint)(iVar5 << 4) + 8)].assigned;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      (&local_c0,this_00,(pair<unsigned_long,_unsigned_long> *)&local_d8);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end(&local_70,this_00);
            pPVar2 = &local_c0.super_iterator.super_const_iterator.path;
            pPVar3 = &local_70.path;
            pEVar15 = (EVP_PKEY_CTX *)pPVar3;
            bVar12 = IntervalMapDetails::Path::operator==(pPVar2,pPVar3);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar3,pEVar15);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar2,pEVar15);
            if (!bVar12) {
              return true;
            }
            goto LAB_003b753d;
          }
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar18] & pcVar1[0xf]) == 0) break;
      lVar14 = uVar13 + uVar16;
      uVar16 = uVar16 + 1;
      uVar13 = lVar14 + 1U & uVar4;
    } while (uVar16 <= uVar4);
LAB_003b753d:
    uVar19 = uVar19 >> ((this->rvalues).field_0x130 & 0x3f);
    uVar4 = *(ulong *)&(this->rvalues).field_0x138;
    uVar13 = 0;
    bVar12 = false;
    do {
      pcVar1 = (char *)(*(long *)&(this->rvalues).field_0x140 + uVar19 * 0x10);
      auVar21[0] = -(*pcVar1 == cVar8);
      auVar21[1] = -(pcVar1[1] == cVar9);
      auVar21[2] = -(pcVar1[2] == cVar10);
      auVar21[3] = -(pcVar1[3] == bVar11);
      auVar21[4] = -(pcVar1[4] == cVar8);
      auVar21[5] = -(pcVar1[5] == cVar9);
      auVar21[6] = -(pcVar1[6] == cVar10);
      auVar21[7] = -(pcVar1[7] == bVar11);
      auVar21[8] = -(pcVar1[8] == cVar8);
      auVar21[9] = -(pcVar1[9] == cVar9);
      auVar21[10] = -(pcVar1[10] == cVar10);
      auVar21[0xb] = -(pcVar1[0xb] == bVar11);
      auVar21[0xc] = -(pcVar1[0xc] == cVar8);
      auVar21[0xd] = -(pcVar1[0xd] == cVar9);
      auVar21[0xe] = -(pcVar1[0xe] == cVar10);
      auVar21[0xf] = -(pcVar1[0xf] == bVar11);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
      if (uVar17 != 0) {
        lVar14 = *(long *)&(this->rvalues).field_0x148 + uVar19 * 0x438;
        do {
          uVar6 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar14 + (ulong)uVar6 * 0x48) == symbol) {
            this_01 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                      (lVar14 + (ulong)uVar6 * 0x48 + 8);
            IntervalMap<unsigned_long,_std::monostate,_3U>::find
                      ((overlap_iterator *)&local_c0,this_01,
                       (pair<unsigned_long,_unsigned_long> *)&local_d8);
            IntervalMap<unsigned_long,_std::monostate,_3U>::end((const_iterator *)&local_70,this_01)
            ;
            pPVar2 = &local_c0.super_iterator.super_const_iterator.path;
            pPVar3 = &local_70.path;
            pEVar15 = (EVP_PKEY_CTX *)pPVar3;
            bVar12 = IntervalMapDetails::Path::operator==(pPVar2,pPVar3);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar3,pEVar15);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar2,pEVar15);
            return !bVar12;
          }
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar18] & pcVar1[0xf]) == 0) {
        return false;
      }
      lVar14 = uVar19 + uVar13;
      uVar13 = uVar13 + 1;
      uVar19 = lVar14 + 1U & uVar4;
    } while (uVar13 <= uVar4);
  }
  return bVar12;
}

Assistant:

bool DataFlowAnalysis::isReferenced(const ValueSymbol& symbol, const Expression& lsp) const {
    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds)
        return isReferenced(symbol);

    {
        auto it = symbolToSlot.find(&symbol);
        if (it != symbolToSlot.end()) {
            auto& symbolState = lvalues[it->second];
            if (symbolState.assigned.find(*bounds) != symbolState.assigned.end())
                return true;
        }
    }
    {
        auto it = rvalues.find(&symbol);
        if (it != rvalues.end() && it->second.find(*bounds) != it->second.end())
            return true;
    }

    return false;
}